

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laplace_pyramid.h
# Opt level: O0

void gimage::createLaplacianPyramid<float>
               (vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                *p,Image<float,_gimage::PixelTraits<float>_> *image)

{
  int iVar1;
  long *plVar2;
  reference pvVar3;
  long lVar4;
  long lVar5;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
  *in_RDI;
  float fVar6;
  __type _Var7;
  __type _Var8;
  double dVar9;
  long i_2;
  int in_stack_0000002c;
  long k_2;
  long i_1;
  long k_1;
  long i;
  long k;
  float *px;
  int d;
  long h;
  long w;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_00000078;
  int l;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_00000080;
  int n;
  long local_90;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_ffffffffffffff78;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_ffffffffffffff80;
  long in_stack_ffffffffffffff88;
  long k_00;
  long i_00;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_ffffffffffffffa0;
  long local_58;
  float *local_50;
  int local_44;
  int local_2c;
  long local_28;
  long local_20;
  int local_14;
  Image<float,_gimage::PixelTraits<float>_> *local_10;
  vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
  *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI);
  local_28 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10);
  plVar2 = std::min<long>(&local_20,&local_28);
  local_14 = (int)*plVar2;
  if (local_14 < 2) {
    local_14 = 0;
  }
  else {
    _Var7 = std::log<int>(0);
    _Var8 = std::log<int>(0);
    dVar9 = floor(_Var7 / _Var8);
    local_14 = (int)dVar9;
  }
  std::
  vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
  ::resize((vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
            *)in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
  if (local_14 != 0) {
    std::
    vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
    ::operator[](local_8,0);
    Image<float,_gimage::PixelTraits<float>_>::setImage
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    for (local_2c = 0; local_2c < local_14 + -1; local_2c = local_2c + 1) {
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[](local_8,(long)(local_2c + 1));
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[](local_8,(long)local_2c);
      reduceGauss<float,float>(in_stack_00000080,in_stack_00000078);
      pvVar3 = std::
               vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
               ::operator[](local_8,(long)local_2c);
      lVar4 = Image<float,_gimage::PixelTraits<float>_>::getWidth(pvVar3);
      pvVar3 = std::
               vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
               ::operator[](local_8,(long)local_2c);
      lVar5 = Image<float,_gimage::PixelTraits<float>_>::getHeight(pvVar3);
      local_44 = 0;
      while( true ) {
        pvVar3 = std::
                 vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                 ::operator[](local_8,(long)local_2c);
        iVar1 = Image<float,_gimage::PixelTraits<float>_>::getDepth(pvVar3);
        if (iVar1 <= local_44) break;
        pvVar3 = std::
                 vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                 ::operator[](local_8,(long)local_2c);
        local_50 = Image<float,_gimage::PixelTraits<float>_>::getPtr(pvVar3,0,0,local_44);
        for (local_58 = 0; local_58 < 2 && local_58 < lVar5; local_58 = local_58 + 1) {
          for (in_stack_ffffffffffffffa0 = (Image<float,_gimage::PixelTraits<float>_> *)0x0;
              (long)in_stack_ffffffffffffffa0 < lVar4;
              in_stack_ffffffffffffffa0 =
                   (Image<float,_gimage::PixelTraits<float>_> *)
                   ((long)&in_stack_ffffffffffffffa0->depth + 1)) {
            std::
            vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
            ::operator[](local_8,(long)(local_2c + 1));
            fVar6 = expandGaussPixel<float>
                              ((Image<float,_gimage::PixelTraits<float>_> *)k_1,i_1,k_2,
                               in_stack_0000002c);
            *local_50 = *local_50 - fVar6;
            local_50 = local_50 + 1;
          }
        }
        for (i_00 = 2; i_00 < lVar5 + -2; i_00 = i_00 + 1) {
          if (0 < lVar4) {
            std::
            vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
            ::operator[](local_8,(long)(local_2c + 1));
            fVar6 = expandGaussPixel<float>
                              ((Image<float,_gimage::PixelTraits<float>_> *)k_1,i_1,k_2,
                               in_stack_0000002c);
            *local_50 = *local_50 - fVar6;
            local_50 = local_50 + 1;
          }
          if (1 < lVar4) {
            std::
            vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
            ::operator[](local_8,(long)(local_2c + 1));
            fVar6 = expandGaussPixel<float>
                              ((Image<float,_gimage::PixelTraits<float>_> *)k_1,i_1,k_2,
                               in_stack_0000002c);
            *local_50 = *local_50 - fVar6;
            local_50 = local_50 + 1;
          }
          for (k_00 = 2; k_00 < lVar4 + -2; k_00 = k_00 + 1) {
            std::
            vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
            ::operator[](local_8,(long)(local_2c + 1));
            fVar6 = expandGaussPixelInner<float>
                              (in_stack_ffffffffffffffa0,i_00,k_00,
                               (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
            *local_50 = *local_50 - fVar6;
            local_50 = local_50 + 1;
          }
          if (2 < lVar4) {
            std::
            vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
            ::operator[](local_8,(long)(local_2c + 1));
            fVar6 = expandGaussPixel<float>
                              ((Image<float,_gimage::PixelTraits<float>_> *)k_1,i_1,k_2,
                               in_stack_0000002c);
            *local_50 = *local_50 - fVar6;
            local_50 = local_50 + 1;
          }
          if (3 < lVar4) {
            std::
            vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
            ::operator[](local_8,(long)(local_2c + 1));
            fVar6 = expandGaussPixel<float>
                              ((Image<float,_gimage::PixelTraits<float>_> *)k_1,i_1,k_2,
                               in_stack_0000002c);
            *local_50 = *local_50 - fVar6;
            local_50 = local_50 + 1;
          }
        }
        plVar2 = std::max<long>((long *)&stack0xffffffffffffff80,(long *)&stack0xffffffffffffff78);
        for (in_stack_ffffffffffffff88 = *plVar2; in_stack_ffffffffffffff88 < lVar5;
            in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 + 1) {
          for (local_90 = 0; local_90 < lVar4; local_90 = local_90 + 1) {
            std::
            vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
            ::operator[](local_8,(long)(local_2c + 1));
            fVar6 = expandGaussPixel<float>
                              ((Image<float,_gimage::PixelTraits<float>_> *)k_1,i_1,k_2,
                               in_stack_0000002c);
            *local_50 = *local_50 - fVar6;
            local_50 = local_50 + 1;
          }
        }
        local_44 = local_44 + 1;
      }
    }
  }
  return;
}

Assistant:

void createLaplacianPyramid(std::vector<ImageFloat> &p,
  const Image<T> &image)
{
  // determine number of levels

  int n=std::min(image.getWidth(), image.getHeight());

  if (n >= 2)
  {
    n=static_cast<int>(std::floor(std::log(n)/std::log(2)));
  }
  else
  {
    n=0;
  }

  p.resize(n);

  if (n == 0) return; // input image is too small

  // populate highest level with given image

  p[0].setImage(image);

  // for all other levels

  for (int l=0; l<n-1; l++)
  {
    // compute downscaled Gaussian image for next level

    reduceGauss(p[l+1], p[l]);

    // compute Laplacian as difference of Gaussian

    const long w=p[l].getWidth();
    const long h=p[l].getHeight();

    // for all color channels

    for (int d=0; d<p[l].getDepth(); d++)
    {
      float *px=p[l].getPtr(0, 0, d);
      for (long k=0; k<2 && k<h; k++)
      {
        for (long i=0; i<w; i++)
        {
          *px++-=expandGaussPixel(p[l+1], i, k, d);
        }
      }

      for (long k=2; k<h-2; k++)
      {
        if (w > 0) *px++-=expandGaussPixel(p[l+1], 0, k, d);
        if (w > 1) *px++-=expandGaussPixel(p[l+1], 1, k, d);

        for (long i=2; i<w-2; i++)
        {
          *px++-=expandGaussPixelInner(p[l+1], i, k, d);
        }

        if (w > 2) *px++-=expandGaussPixel(p[l+1], w-2, k, d);
        if (w > 3) *px++-=expandGaussPixel(p[l+1], w-1, k, d);
      }

      for (long k=std::max(0l, h-2); k<h; k++)
      {
        for (long i=0; i<w; i++)
        {
          *px++-=expandGaussPixel(p[l+1], i, k, d);
        }
      }
    }
  }
}